

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::tuple_caster<std::pair,long,int>::
       cast_impl<std::pair<long,int>const,0ul,1ul>(undefined8 *src)

{
  undefined8 uVar1;
  handle hVar2;
  array<pybind11::object,_2UL> *__range3;
  long lVar3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  object local_28;
  long local_20;
  handle local_18;
  
  hVar2.m_ptr = (PyObject *)PyLong_FromSsize_t(*src);
  local_28.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  local_20 = PyLong_FromSsize_t((long)*(int *)(src + 1));
  if (local_20 == 0 || hVar2.m_ptr == (PyObject *)0x0) {
    hVar2.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple((tuple *)&local_18,2);
    hVar2.m_ptr = local_18.m_ptr;
    lVar3 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_28.super_handle.m_ptr + lVar3);
      *(undefined8 *)((long)&local_28.super_handle.m_ptr + lVar3) = 0;
      *(undefined8 *)((long)&local_18.m_ptr[1].ob_type + lVar3) = uVar1;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x10);
    local_18.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_18);
  }
  lVar3 = 8;
  do {
    object::~object((object *)((long)&local_28.super_handle.m_ptr + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }